

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_hashmap_key_exists(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxi32 sVar1;
  uint iBool;
  
  iBool = 0;
  if ((1 < nArg) && (iBool = 0, (apArg[1]->iFlags & 0x40) != 0)) {
    sVar1 = jx9HashmapLookup((jx9_hashmap *)(apArg[1]->x).pOther,*apArg,(jx9_hashmap_node **)0x0);
    iBool = (uint)(sVar1 == 0);
  }
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int jx9_hashmap_key_exists(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[1]) ){
		/* Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the lookup */
	rc = jx9HashmapLookup((jx9_hashmap *)apArg[1]->x.pOther, apArg[0], 0);
	/* lookup result */
	jx9_result_bool(pCtx, rc == SXRET_OK ? 1 : 0);
	return JX9_OK;
}